

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::InternReadFile
          (COBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  iterator *piVar1;
  _Elt_pointer psVar2;
  Type TVar3;
  long *plVar4;
  element_type *peVar5;
  Node *pNVar6;
  _Elt_pointer ppNVar7;
  Node *pNVar8;
  undefined4 uVar9;
  _Elt_pointer psVar10;
  int iVar11;
  StreamReader<false,_false> *this_00;
  undefined4 extraout_var;
  Logger *this_01;
  deque<Assimp::COB::Face*,std::allocator<Assimp::COB::Face*>> *this_02;
  _Map_pointer ppsVar12;
  aiMesh **__s;
  aiMaterial **__s_00;
  aiLight **__s_01;
  aiCamera **__s_02;
  Node *pNVar13;
  aiNode *paVar14;
  _Elt_pointer psVar15;
  _Elt_pointer psVar16;
  shared_ptr<Assimp::COB::Node> *psVar17;
  ulong uVar18;
  long lVar19;
  shared_ptr<Assimp::COB::Node> *n_1;
  _Elt_pointer psVar20;
  _Elt_pointer psVar21;
  long lVar22;
  long lVar23;
  size_t n_2;
  _Elt_pointer psVar24;
  uint *puVar25;
  ulong uVar26;
  ulong uVar27;
  Face *f;
  shared_ptr<Assimp::COB::Node> *n;
  _Elt_pointer psVar28;
  _Map_pointer ppsVar29;
  ulong uVar30;
  unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  stream;
  char head [32];
  Scene scene;
  FlipWindingOrderProcess flip;
  _Map_pointer local_2d8;
  char cStack_2b0;
  undefined3 uStack_2af;
  undefined1 uStack_2ac;
  undefined2 uStack_2ab;
  char cStack_2a9;
  char local_2a8;
  Scene local_288;
  char *local_1e8;
  char local_1d8 [16];
  char *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined2 local_1b4;
  undefined1 local_1b2;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_288.nodes.
  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                       *)&local_288,0);
  local_288.materials.
  super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.thumbnail.super_ChunkInfo.id = 0;
  local_288.thumbnail.super_ChunkInfo.parent_id = 0;
  local_288.materials.
  super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.materials.
  super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.thumbnail.super_ChunkInfo.version = 0;
  local_288.thumbnail.super_ChunkInfo.size = 0xffffffff;
  local_288.thumbnail.orig_size = 0;
  local_288.thumbnail.buff_zipped.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.thumbnail.buff_zipped.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.thumbnail.buff_zipped.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (StreamReader<false,_false> *)operator_new(0x38);
  pNVar13 = (Node *)(local_1a8 + 0x10);
  local_1a8._0_8_ = pNVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
  iVar11 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8._0_8_);
  StreamReader<false,_false>::StreamReader(this_00,(IOStream *)CONCAT44(extraout_var,iVar11),false);
  if ((Node *)local_1a8._0_8_ != pNVar13) {
    operator_delete((void *)local_1a8._0_8_);
  }
  plVar4 = (long *)this_00->current;
  StreamReader<false,_false>::SetPtr(this_00,(int8_t *)(plVar4 + 4));
  lVar23 = plVar4[1];
  uVar9 = *(undefined4 *)((long)plVar4 + 0xc);
  lVar22 = plVar4[2];
  uStack_2ac = (undefined1)uVar9;
  uStack_2ab = (undefined2)((uint)uVar9 >> 8);
  cStack_2a9 = (char)((uint)uVar9 >> 0x18);
  cStack_2b0 = (char)(int)lVar23;
  if (cStack_2b0 != ' ' || *plVar4 != 0x69726167696c6143) {
    local_1a8._0_8_ = pNVar13;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Could not found magic id: `Caligari`","");
    ThrowException((string *)local_1a8);
  }
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[18]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [18])"File format tag: ");
  uStack_2af = (undefined3)((uint)(int)lVar23 >> 8);
  local_1b8 = CONCAT13(uStack_2ac,uStack_2af);
  local_1b4 = uStack_2ab;
  local_1c0 = 6;
  local_1b2 = 0;
  local_1c8 = (char *)&local_1b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1b8,6);
  std::__cxx11::stringbuf::str();
  Logger::info(this_01,local_1e8);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_2a8 = (char)(int)lVar22;
  if (local_2a8 != 'L') {
    local_1a8._0_8_ = pNVar13;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"File is big-endian, which is not supported","");
    ThrowException((string *)local_1a8);
  }
  if (cStack_2a9 == 'A') {
    ReadAsciiFile(this,&local_288,this_00);
  }
  else {
    ReadBinaryFile(this,&local_288,this_00);
  }
  psVar16 = local_288.nodes.
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_288.nodes.
      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_288.nodes.
      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_2d8 = local_288.nodes.
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    psVar20 = local_288.nodes.
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    psVar28 = local_288.nodes.
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    do {
      peVar5 = (psVar28->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar5->type == TYPE_MESH) {
        pNVar13 = (Node *)peVar5[1].temp_children.
                          super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pNVar6 = (Node *)peVar5[1].temp_children.
                         super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_first;
        if (pNVar13 != pNVar6) {
          do {
            this_02 = (deque<Assimp::COB::Face*,std::allocator<Assimp::COB::Face*>> *)
                      std::
                      map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                      ::operator[]((map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                                    *)&peVar5[1].temp_children.
                                       super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish,(key_type *)pNVar13
                                  );
            local_1a8._0_8_ = pNVar13;
            if (*(undefined8 **)(this_02 + 0x30) == (undefined8 *)(*(long *)(this_02 + 0x40) + -8))
            {
              std::deque<Assimp::COB::Face*,std::allocator<Assimp::COB::Face*>>::
              _M_push_back_aux<Assimp::COB::Face*>(this_02,(Face **)local_1a8);
            }
            else {
              **(undefined8 **)(this_02 + 0x30) = pNVar13;
              *(long *)(this_02 + 0x30) = *(long *)(this_02 + 0x30) + 8;
            }
            pNVar13 = (Node *)&pNVar13->temp_children;
          } while (pNVar13 != pNVar6);
        }
      }
      psVar10 = local_288.nodes.
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppsVar29 = local_288.nodes.
                 super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      psVar24 = local_288.nodes.
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      psVar21 = local_288.nodes.
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      psVar28 = psVar28 + 1;
      if (psVar28 == psVar20) {
        psVar28 = local_2d8[1];
        local_2d8 = local_2d8 + 1;
        psVar20 = psVar28 + 0x20;
      }
      psVar15 = local_288.nodes.
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      psVar2 = local_288.nodes.
               super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppsVar12 = local_288.nodes.
                 super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
    } while (psVar28 != psVar16);
    while (psVar15 !=
           local_288.nodes.
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      peVar5 = (psVar15->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (((peVar5->type == TYPE_MESH) &&
          (peVar5[1].temp_children.
           super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>.
           _M_impl.super__Deque_impl_data._M_map != *(_Map_pointer *)&peVar5[1].type)) &&
         (*(_func_int ***)&peVar5[1].super_ChunkInfo != peVar5[1]._vptr_Node)) {
        pScene->mNumMeshes = pScene->mNumMeshes + (int)peVar5[1].name._M_string_length;
      }
      psVar15 = psVar15 + 1;
      if (psVar15 == psVar2) {
        psVar15 = ppsVar12[1];
        ppsVar12 = ppsVar12 + 1;
        psVar2 = psVar15 + 0x20;
      }
    }
    uVar30 = (ulong)pScene->mNumMeshes << 3;
    __s = (aiMesh **)operator_new__(uVar30);
    memset(__s,0,uVar30);
    pScene->mMeshes = __s;
    __s_00 = (aiMaterial **)operator_new__(uVar30);
    memset(__s_00,0,uVar30);
    pScene->mMaterials = __s_00;
    pScene->mNumMeshes = 0;
    if (psVar21 != psVar10) {
      do {
        TVar3 = ((psVar21->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->type;
        puVar25 = &pScene->mNumLights;
        if ((TVar3 == TYPE_LIGHT) || (puVar25 = &pScene->mNumCameras, TVar3 == TYPE_CAMERA)) {
          *puVar25 = *puVar25 + 1;
        }
        psVar21 = psVar21 + 1;
        if (psVar21 == psVar24) {
          psVar21 = ppsVar29[1];
          ppsVar29 = ppsVar29 + 1;
          psVar24 = psVar21 + 0x20;
        }
      } while (psVar21 != psVar10);
    }
    if ((ulong)pScene->mNumLights != 0) {
      uVar30 = (ulong)pScene->mNumLights << 3;
      __s_01 = (aiLight **)operator_new__(uVar30);
      memset(__s_01,0,uVar30);
      pScene->mLights = __s_01;
    }
    if ((ulong)pScene->mNumCameras != 0) {
      uVar30 = (ulong)pScene->mNumCameras << 3;
      __s_02 = (aiCamera **)operator_new__(uVar30);
      memset(__s_02,0,uVar30);
      pScene->mCameras = __s_02;
    }
    pScene->mNumCameras = 0;
    pScene->mNumLights = 0;
    pNVar13 = (Node *)operator_new(0xd8);
    COB::Node::Node(pNVar13,TYPE_GROUP);
    pNVar13->_vptr_Node = (_func_int **)&PTR__Node_00821020;
    lVar23 = 0;
    for (uVar30 = 0;
        uVar30 < ((long)local_288.nodes.
                        super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)local_288.nodes.
                        super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                 ((long)local_288.nodes.
                        super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)local_288.nodes.
                        super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                 ((((ulong)((long)local_288.nodes.
                                  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node -
                           (long)local_288.nodes.
                                 super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                 (ulong)(local_288.nodes.
                         super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
                 0x20; uVar30 = uVar30 + 1) {
      uVar18 = ((long)local_288.nodes.
                      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_288.nodes.
                      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar30;
      if (uVar18 < 0x20) {
        psVar16 = local_288.nodes.
                  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + uVar30;
      }
      else {
        uVar26 = uVar18 >> 5 | 0xf800000000000000;
        if (0 < (long)uVar18) {
          uVar26 = uVar18 >> 5;
        }
        psVar16 = local_288.nodes.
                  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar26] + uVar18 + uVar26 * -0x20
        ;
      }
      pNVar6 = (psVar16->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((pNVar6->super_ChunkInfo).parent_id == 0) {
        ppNVar7 = (pNVar13->temp_children).
                  super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_1a8._0_8_ = pNVar6;
        if (ppNVar7 ==
            (pNVar13->temp_children).
            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<Assimp::COB::Node_const*,std::allocator<Assimp::COB::Node_const*>>::
          _M_push_back_aux<Assimp::COB::Node_const*>
                    ((deque<Assimp::COB::Node_const*,std::allocator<Assimp::COB::Node_const*>> *)
                     &pNVar13->temp_children,(Node **)local_1a8);
        }
        else {
          *ppNVar7 = pNVar6;
          piVar1 = &(pNVar13->temp_children).
                    super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
      lVar22 = lVar23;
      for (uVar18 = uVar30;
          uVar18 < ((long)local_288.nodes.
                          super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_288.nodes.
                          super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                   ((long)local_288.nodes.
                          super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_288.nodes.
                          super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                   ((((ulong)((long)local_288.nodes.
                                    super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_288.nodes.
                                   super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(local_288.nodes.
                           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
                   * 0x20; uVar18 = uVar18 + 1) {
        lVar19 = (long)local_288.nodes.
                       super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur -
                 (long)local_288.nodes.
                       super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
        uVar26 = lVar19 + uVar18;
        if (uVar26 < 0x20) {
          psVar17 = (shared_ptr<Assimp::COB::Node> *)
                    ((long)&((local_288.nodes.
                              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                            super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar22);
        }
        else {
          uVar27 = uVar26 >> 5 | 0xf800000000000000;
          if (0 < (long)uVar26) {
            uVar27 = uVar26 >> 5;
          }
          psVar17 = local_288.nodes.
                    super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node[uVar27] +
                    lVar19 + uVar27 * -0x20 + uVar18;
        }
        pNVar8 = (psVar17->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        if ((pNVar8->super_ChunkInfo).parent_id == (pNVar6->super_ChunkInfo).id) {
          ppNVar7 = (pNVar6->temp_children).
                    super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_1a8._0_8_ = pNVar8;
          if (ppNVar7 ==
              (pNVar6->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Assimp::COB::Node_const*,std::allocator<Assimp::COB::Node_const*>>::
            _M_push_back_aux<Assimp::COB::Node_const*>
                      ((deque<Assimp::COB::Node_const*,std::allocator<Assimp::COB::Node_const*>> *)
                       &pNVar6->temp_children,(Node **)local_1a8);
          }
          else {
            *ppNVar7 = pNVar8;
            piVar1 = &(pNVar6->temp_children).
                      super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
        lVar22 = lVar22 + 0x10;
      }
      lVar23 = lVar23 + 0x10;
    }
    paVar14 = BuildNodes(this,pNVar13,&local_288,pScene);
    pScene->mRootNode = paVar14;
    FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)local_1a8);
    FlipWindingOrderProcess::Execute((FlipWindingOrderProcess *)local_1a8,pScene);
    FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)local_1a8);
    (*pNVar13->_vptr_Node[1])();
    if (this_00 != (StreamReader<false,_false> *)0x0) {
      StreamReader<false,_false>::~StreamReader(this_00);
      operator_delete(this_00);
    }
    if (local_288.thumbnail.buff_zipped.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.thumbnail.buff_zipped.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::~vector
              (&local_288.materials);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::~deque(&local_288.nodes);
    return;
  }
  local_1a8._0_8_ = pNVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"No nodes loaded","");
  ThrowException((string *)local_1a8);
}

Assistant:

void COBImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    COB::Scene scene;
    std::unique_ptr<StreamReaderLE> stream(new StreamReaderLE( pIOHandler->Open(pFile,"rb")) );

    // check header
    char head[32];
    stream->CopyAndAdvance(head,32);
    if (strncmp(head,"Caligari ",9) != 0) {
        ThrowException("Could not found magic id: `Caligari`");
    }

    ASSIMP_LOG_INFO_F("File format tag: ",std::string(head+9,6));
    if (head[16]!='L') {
        ThrowException("File is big-endian, which is not supported");
    }

    // load data into intermediate structures
    if (head[15]=='A') {
        ReadAsciiFile(scene, stream.get());
    }
    else {
        ReadBinaryFile(scene, stream.get());
    }
    if(scene.nodes.empty()) {
        ThrowException("No nodes loaded");
    }

    // sort faces by material indices
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_MESH) {
            Mesh& mesh = (Mesh&)(*n.get());
            for(Face& f : mesh.faces) {
                mesh.temp_map[f.material].push_back(&f);
            }
        }
    }

    // count meshes
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_MESH) {
            Mesh& mesh = (Mesh&)(*n.get());
            if (mesh.vertex_positions.size() && mesh.texture_coords.size()) {
                pScene->mNumMeshes += static_cast<unsigned int>(mesh.temp_map.size());
            }
        }
    }
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes]();
    pScene->mNumMeshes = 0;

    // count lights and cameras
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_LIGHT) {
            ++pScene->mNumLights;
        }
        else if (n->type == Node::TYPE_CAMERA) {
            ++pScene->mNumCameras;
        }
    }

    if (pScene->mNumLights) {
        pScene->mLights  = new aiLight*[pScene->mNumLights]();
    }
    if (pScene->mNumCameras) {
        pScene->mCameras = new aiCamera*[pScene->mNumCameras]();
    }
    pScene->mNumLights = pScene->mNumCameras = 0;

    // resolve parents by their IDs and build the output graph
    std::unique_ptr<Node> root(new Group());
    for(size_t n = 0; n < scene.nodes.size(); ++n) {
        const Node& nn = *scene.nodes[n].get();
        if(nn.parent_id==0) {
            root->temp_children.push_back(&nn);
        }

        for(size_t m = n; m < scene.nodes.size(); ++m) {
            const Node& mm = *scene.nodes[m].get();
            if (mm.parent_id == nn.id) {
                nn.temp_children.push_back(&mm);
            }
        }
    }

    pScene->mRootNode = BuildNodes(*root.get(),scene,pScene);
	//flip normals after import
    FlipWindingOrderProcess flip;
    flip.Execute( pScene );
}